

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLinker.cpp
# Opt level: O3

int __thiscall COLLADASaxFWL::FormulasLinker::link(FormulasLinker *this,char *__from,char *__to)

{
  undefined4 uVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar3;
  undefined4 extraout_var_00;
  long *plVar4;
  undefined4 extraout_var_01;
  undefined1 *in_RCX;
  BinaryComparisonExpression *comparison;
  long lVar5;
  long lVar6;
  
  uVar1 = (**(code **)(*(long *)__to + 0x18))(__to);
  switch(uVar1) {
  case 0:
  case 2:
    *in_RCX = 1;
    break;
  case 1:
    pcVar3 = (char *)(**(code **)(*(long *)__to + 0x48))(__to);
    iVar2 = link(this,__from,pcVar3);
    (**(code **)(*(long *)__to + 0x50))(__to,iVar2);
    break;
  case 3:
    plVar4 = (long *)(**(code **)(*(long *)__to + 0x50))(__to);
    if (plVar4[1] - *plVar4 != 0) {
      lVar6 = plVar4[1] - *plVar4 >> 3;
      lVar5 = 0;
      do {
        iVar2 = link(this,__from,*(char **)(*plVar4 + lVar5 * 8));
        *(ulong *)(*plVar4 + lVar5 * 8) = CONCAT44(extraout_var,iVar2);
        lVar5 = lVar5 + 1;
      } while (lVar6 + (ulong)(lVar6 == 0) != lVar5);
    }
    break;
  case 4:
    pcVar3 = (char *)(**(code **)(*(long *)__to + 0x48))(__to);
    iVar2 = link(this,__from,pcVar3);
    (**(code **)(*(long *)__to + 0x50))(__to,iVar2);
    pcVar3 = (char *)(**(code **)(*(long *)__to + 0x58))(__to);
    iVar2 = link(this,__from,pcVar3);
    (**(code **)(*(long *)__to + 0x60))(__to,iVar2);
    break;
  case 5:
    plVar4 = (long *)(**(code **)(*(long *)__to + 0x50))(__to);
    if (plVar4[1] - *plVar4 != 0) {
      lVar6 = plVar4[1] - *plVar4 >> 3;
      lVar5 = 0;
      do {
        iVar2 = link(this,__from,*(char **)(*plVar4 + lVar5 * 8));
        *(ulong *)(*plVar4 + lVar5 * 8) = CONCAT44(extraout_var_00,iVar2);
        lVar5 = lVar5 + 1;
      } while (lVar6 + (ulong)(lVar6 == 0) != lVar5);
    }
    break;
  case 6:
    plVar4 = (long *)(**(code **)(*(long *)__to + 0x38))(__to);
    if (plVar4[1] - *plVar4 != 0) {
      lVar6 = plVar4[1] - *plVar4 >> 3;
      lVar5 = 0;
      do {
        iVar2 = link(this,__from,*(char **)(*plVar4 + lVar5 * 8));
        *(ulong *)(*plVar4 + lVar5 * 8) = CONCAT44(extraout_var_01,iVar2);
        lVar5 = lVar5 + 1;
      } while (lVar6 + (ulong)(lVar6 == 0) != lVar5);
    }
    break;
  case 7:
    pcVar3 = (char *)(**(code **)(*(long *)__to + 0x30))(__to);
    iVar2 = link(this,__from,pcVar3);
    (**(code **)(*(long *)__to + 0x38))(__to,iVar2);
    break;
  case 8:
    iVar2 = link(this,__from,__to);
    (**(code **)(*(long *)__to + 8))(__to);
    return iVar2;
  default:
    __to = (char *)0x0;
  }
  return (int)__to;
}

Assistant:

MathML::AST::INode* FormulasLinker::link( COLLADAFW::Formula* formula, MathML::AST::INode* astNode, bool& success)
	{
		switch ( astNode->getNodeType() )
		{
		case MathML::AST::INode::ARITHMETIC:
			{
				MathML::AST::ArithmeticExpression* arithmetic = (MathML::AST::ArithmeticExpression*)astNode;
				MathML::AST::NodeList& operands = arithmetic->getOperands();
				for ( size_t i = 0, count = operands.size(); i < count; ++i )
				{
					operands[i] = link(formula, operands[i], success);
				}
			}
			return astNode;
		case MathML::AST::INode::COMPARISON:
			{
				MathML::AST::BinaryComparisonExpression* comparison = (MathML::AST::BinaryComparisonExpression*)astNode;
				comparison->setLeftOperand(link(formula, comparison->getLeftOperand(), success));
				comparison->setRightOperand(link(formula, comparison->getRightOperand(), success));
			}
			return astNode;
		case MathML::AST::INode::CONSTANT:
		case MathML::AST::INode::VARIABLE:
			success = true;
			return astNode;
		case MathML::AST::INode::FRAGMENT:
			{
				MathML::AST::FragmentExpression* fragment = (MathML::AST::FragmentExpression*)astNode;
				fragment->setFragment( link( formula, fragment->getFragment(), success) );
			}
			return astNode;
		case MathML::AST::INode::LOGICAL:
			{
				MathML::AST::LogicExpression* logical = (MathML::AST::LogicExpression*)astNode;
				MathML::AST::NodeList& operands = logical->getOperands();
				for ( size_t i = 0, count = operands.size(); i < count; ++i )
				{
					operands[i] = link(formula, operands[i], success);
				}
			}
			return astNode;
		case MathML::AST::INode::UNARY:
			{
				MathML::AST::UnaryExpression* unary = (MathML::AST::UnaryExpression*)astNode;
				unary->setOperand(link(formula, unary->getOperand(), success));
			}
			return astNode;
		case MathML::AST::INode::FUNCTION:
			{
				MathML::AST::FunctionExpression* func = (MathML::AST::FunctionExpression*)astNode;
				MathML::AST::NodeList& operands = func->getParameterList();
				for ( size_t i = 0, count = operands.size(); i < count; ++i )
				{
					operands[i] = link(formula, operands[i], success);
				}
			}
			return astNode;
		case MathML::AST::INode::USERDEFINED:
			{
				COLLADACsymbol* csymbol = (COLLADACsymbol*) astNode;
				MathML::AST::INode* linkedNode = link( formula, csymbol, success );
				delete csymbol;
				return linkedNode;
			}
		default:
			COLLADABU_ASSERT(false);
		}
		return 0;
	}